

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

uint fl_utf8from_mb(char *dst,uint dstlen,char *src,uint srclen)

{
  wchar_t wVar1;
  uint uVar2;
  size_t sVar3;
  uint local_1044;
  uint ret;
  wchar_t length;
  wchar_t *buf;
  wchar_t lbuf [1024];
  uint srclen_local;
  char *src_local;
  uint dstlen_local;
  char *dst_local;
  
  wVar1 = fl_utf8locale();
  if (wVar1 == L'\0') {
    _ret = &buf;
    sVar3 = mbstowcs((wchar_t *)_ret,src,0x400);
    local_1044 = (uint)sVar3;
    if (0x3ff < (int)local_1044) {
      sVar3 = mbstowcs((wchar_t *)0x0,src,0);
      local_1044 = (int)sVar3 + 1;
      _ret = (wchar_t **)malloc((long)(int)local_1044 << 2);
      mbstowcs((wchar_t *)_ret,src,(long)(int)local_1044);
    }
    if (-1 < (int)local_1044) {
      uVar2 = fl_utf8fromwc(dst,dstlen,(wchar_t *)_ret,local_1044);
      if (_ret == &buf) {
        return uVar2;
      }
      free(_ret);
      return uVar2;
    }
  }
  if (srclen < dstlen) {
    memcpy(dst,src,(ulong)srclen);
    dst[srclen] = '\0';
  }
  return srclen;
}

Assistant:

unsigned fl_utf8from_mb(char* dst, unsigned dstlen,
		    const char* src, unsigned srclen)
{
  if (!fl_utf8locale()) {
#ifdef WIN32
    wchar_t lbuf[1024];
    wchar_t* buf = lbuf;
    unsigned length;
    unsigned ret;
    length = MultiByteToWideChar(GetACP(), 0, src, srclen, buf, 1024);
    if ((length == 0)&&(GetLastError()==ERROR_INSUFFICIENT_BUFFER)) {
      length = MultiByteToWideChar(GetACP(), 0, src, srclen, 0, 0);
      buf = (wchar_t*)(malloc(length*sizeof(wchar_t)));
      MultiByteToWideChar(GetACP(), 0, src, srclen, buf, length);
    }
    ret = fl_utf8fromwc(dst, dstlen, buf, length);
    if (buf != lbuf) free((void*)buf);
    return ret;
#else
    wchar_t lbuf[1024];
    wchar_t* buf = lbuf;
    int length;
    unsigned ret;
    length = mbstowcs(buf, src, 1024);
    if (length >= 1024) {
      length = mbstowcs(0, src, 0)+1;
      buf = (wchar_t*)(malloc(length*sizeof(wchar_t)));
      mbstowcs(buf, src, length);
    }
    if (length >= 0) {
      ret = fl_utf8fromwc(dst, dstlen, buf, length);
      if (buf != lbuf) free((void*)buf);
      return ret;
    }
    /* errors in conversion return the UTF-8 unchanged */
#endif
  }
  /* identity transform: */
  if (srclen < dstlen) {
    memcpy(dst, src, srclen);
    dst[srclen] = 0;
  } else {
    /* Buffer insufficent or buffer query */
  }
  return srclen;
}